

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::reset_search_structure(search_private *priv)

{
  action_repr *paVar1;
  action_repr **ppaVar2;
  long *in_RDI;
  float fVar3;
  action_repr *ar;
  action_repr *__end1;
  action_repr *__begin1;
  v_array<Search::action_repr> *__range1;
  float x;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float local_34;
  action_repr *local_20;
  
  in_RDI[0x13] = 0;
  in_RDI[0xcc] = 0;
  in_RDI[0x41] = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)((long)in_RDI + 0x244) = 0;
  *(undefined4 *)(in_RDI + 0x49) = 0;
  *(undefined4 *)((long)in_RDI + 0x24c) = 0;
  in_RDI[0x57] = 0;
  *(undefined1 *)((long)in_RDI + 0x271) = 0;
  *(undefined4 *)(in_RDI + 0xf) = 0xfffffffe;
  *(undefined1 *)(in_RDI + 0xc2) = 0;
  if ((*(byte *)((long)in_RDI + 0x2a6) & 1) != 0) {
    fVar3 = log1pf(-*(float *)((long)in_RDI + 0x294));
    local_34 = (float)(ulong)in_RDI[0x5c];
    local_34 = -fVar3 * local_34;
    if (0.6931472 < local_34) {
      in_stack_ffffffffffffffa4 = expf(-local_34);
      in_stack_ffffffffffffffa4 = 1.0 - in_stack_ffffffffffffffa4;
    }
    else {
      in_stack_ffffffffffffffa4 = expm1f(-local_34);
      in_stack_ffffffffffffffa4 = -in_stack_ffffffffffffffa4;
    }
    *(float *)(in_RDI + 0x52) = in_stack_ffffffffffffffa4;
    if (1.0 < *(float *)(in_RDI + 0x52)) {
      *(undefined4 *)(in_RDI + 0x52) = 0x3f800000;
    }
  }
  ppaVar2 = v_array<Search::action_repr>::begin((v_array<Search::action_repr> *)(in_RDI + 0x2b));
  local_20 = *ppaVar2;
  ppaVar2 = v_array<Search::action_repr>::end((v_array<Search::action_repr> *)(in_RDI + 0x2b));
  paVar1 = *ppaVar2;
  for (; local_20 != paVar1; local_20 = local_20 + 1) {
    if (local_20->repr != (features *)0x0) {
      features::delete_v((features *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (local_20->repr != (features *)0x0) {
        operator_delete(local_20->repr);
      }
    }
  }
  v_array<Search::action_repr>::clear
            ((v_array<Search::action_repr> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if ((*(byte *)(in_RDI + 0xd) & 1) == 0) {
    *(ulong *)(*in_RDI + 0x3448) =
         (ulong)(uint)(((int)in_RDI[0x59] * 0x2401b + 0x49bab1) * 0x7fffffff);
  }
  return;
}

Assistant:

void reset_search_structure(search_private& priv)
{
  // NOTE: make sure do NOT reset priv.learn_a_idx
  priv.t = 0;
  priv.meta_t = 0;
  priv.loss_declared_cnt = 0;
  priv.done_with_all_actions = false;
  priv.test_loss = 0.;
  priv.learn_loss = 0.;
  priv.train_loss = 0.;
  priv.num_features = 0;
  priv.should_produce_string = false;
  priv.mix_per_roll_policy = -2;
  priv.force_setup_ec_ref = false;
  if (priv.adaptive_beta)
  {
    float x = -log1pf(-priv.alpha) * (float)priv.total_examples_generated;
    static const float log_of_2 = (float)0.6931471805599453;
    priv.beta = (x <= log_of_2) ? -expm1f(-x) : (1 - expf(-x));  // numerical stability
    // float priv_beta = 1.f - powf(1.f - priv.alpha, (float)priv.total_examples_generated);
    // assert( fabs(priv_beta - priv.beta) < 1e-2 );
    if (priv.beta > 1)
      priv.beta = 1;
  }
  for (Search::action_repr& ar : priv.ptag_to_action)
  {
    if (ar.repr != nullptr)
    {
      ar.repr->delete_v();
      delete ar.repr;
    }
  }
  priv.ptag_to_action.clear();

  if (!priv.cb_learner)  // was: if rollout_all_actions
  {
    priv.all->random_state = (uint32_t)(priv.read_example_last_id * 147483 + 4831921) * 2147483647;
  }
}